

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Native_File_Chooser_GTK.cxx
# Opt level: O0

void __thiscall Fl_GTK_File_Chooser::changed_output_type(Fl_GTK_File_Chooser *this,char *filter)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  gchar *name;
  size_t sVar4;
  size_t sVar5;
  char *__dest;
  char *r;
  char *q;
  char *p;
  char *filter_local;
  Fl_GTK_File_Chooser *this_local;
  
  uVar1 = Fl_FLTK_File_Chooser::options(&this->super_Fl_FLTK_File_Chooser);
  if (((((uVar1 & 8) != 0) && (pcVar3 = strchr(filter,0x28), pcVar3 == (char *)0x0)) &&
      (pcVar3 = strchr(filter,0x7b), pcVar3 == (char *)0x0)) &&
     (((pcVar3 = strchr(filter + 1,0x2a), pcVar3 == (char *)0x0 &&
       (iVar2 = strncmp(filter,"*.",2), iVar2 == 0)) &&
      (name = (*fl_gtk_file_chooser_get_filename)((GtkFileChooser *)this->gtkw_ptr),
      name != (gchar *)0x0)))) {
    pcVar3 = fl_filename_name(name);
    r = strrchr(pcVar3,0x2e);
    if (r == (char *)0x0) {
      sVar4 = strlen(pcVar3);
      r = pcVar3 + sVar4;
    }
    sVar4 = strlen(pcVar3);
    sVar5 = strlen(filter);
    __dest = (char *)operator_new__(sVar4 + sVar5);
    strcpy(__dest,pcVar3);
    strcpy(__dest + ((long)r - (long)pcVar3),filter + 1);
    (*fl_gtk_file_chooser_set_current_name)((GtkFileChooser *)this->gtkw_ptr,__dest);
    if (__dest != (char *)0x0) {
      operator_delete__(__dest);
    }
  }
  return;
}

Assistant:

void Fl_GTK_File_Chooser::changed_output_type(const char *filter)
{
  if ( !(options()&Fl_Native_File_Chooser::USE_FILTER_EXT) ) return;
  if (strchr(filter, '(') || strchr(filter, '{') || strchr(filter+1, '*') || strncmp(filter, "*.", 2)) return;
  const char *p = fl_gtk_file_chooser_get_filename((GtkFileChooser*)gtkw_ptr);
  if (!p) return;
  p = fl_filename_name(p);
  const char *q = strrchr(p, '.');
  if (!q) q = p + strlen(p);
  char *r = new char[strlen(p) + strlen(filter)];
  strcpy(r, p);
  strcpy(r + (q - p), filter + 1);
  fl_gtk_file_chooser_set_current_name((GtkFileChooser*)gtkw_ptr, r);
  delete[] r;
}